

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.c
# Opt level: O0

void sycc444_to_rgb(opj_image_t *img)

{
  byte bVar1;
  ulong uVar2;
  OPJ_INT32 *__ptr;
  OPJ_INT32 *__ptr_00;
  OPJ_INT32 *__ptr_01;
  int upb;
  int offset;
  size_t i;
  size_t max;
  size_t maxh;
  size_t maxw;
  int *cr;
  int *cb;
  int *y;
  int *b;
  int *g;
  int *r;
  int *d2;
  int *d1;
  int *d0;
  opj_image_t *img_local;
  
  bVar1 = (byte)img->comps->prec;
  uVar2 = (ulong)img->comps->w * (ulong)img->comps->h;
  cb = img->comps->data;
  cr = img->comps[1].data;
  maxw = (size_t)img->comps[2].data;
  __ptr = (OPJ_INT32 *)malloc(uVar2 * 4);
  __ptr_00 = (OPJ_INT32 *)malloc(uVar2 * 4);
  __ptr_01 = (OPJ_INT32 *)malloc(uVar2 * 4);
  if (((__ptr == (OPJ_INT32 *)0x0) || (__ptr_00 == (OPJ_INT32 *)0x0)) ||
     (__ptr_01 == (OPJ_INT32 *)0x0)) {
    free(__ptr);
    free(__ptr_00);
    free(__ptr_01);
  }
  else {
    y = __ptr_01;
    b = __ptr_00;
    g = __ptr;
    for (_upb = 0; _upb < uVar2; _upb = _upb + 1) {
      sycc_to_rgb(1 << (bVar1 - 1 & 0x1f),(1 << (bVar1 & 0x1f)) + -1,*cb,*cr,*(int *)maxw,g,b,y);
      cb = cb + 1;
      cr = cr + 1;
      maxw = maxw + 4;
      g = g + 1;
      b = b + 1;
      y = y + 1;
    }
    free(img->comps->data);
    img->comps->data = __ptr;
    free(img->comps[1].data);
    img->comps[1].data = __ptr_00;
    free(img->comps[2].data);
    img->comps[2].data = __ptr_01;
    img->color_space = OPJ_CLRSPC_SRGB;
  }
  return;
}

Assistant:

static void sycc444_to_rgb(opj_image_t *img)
{
	int *d0, *d1, *d2, *r, *g, *b;
	const int *y, *cb, *cr;
	size_t maxw, maxh, max, i;
	int offset, upb;

	upb = (int)img->comps[0].prec;
	offset = 1<<(upb - 1); upb = (1<<upb)-1;

	maxw = (size_t)img->comps[0].w; maxh = (size_t)img->comps[0].h;
	max = maxw * maxh;

	y = img->comps[0].data;
	cb = img->comps[1].data;
	cr = img->comps[2].data;

	d0 = r = (int*)malloc(sizeof(int) * max);
	d1 = g = (int*)malloc(sizeof(int) * max);
	d2 = b = (int*)malloc(sizeof(int) * max);

	if(r == NULL || g == NULL || b == NULL) goto fails;

	for(i = 0U; i < max; ++i)
	{
		sycc_to_rgb(offset, upb, *y, *cb, *cr, r, g, b);
		++y; ++cb; ++cr; ++r; ++g; ++b;
	}
	free(img->comps[0].data); img->comps[0].data = d0;
	free(img->comps[1].data); img->comps[1].data = d1;
	free(img->comps[2].data); img->comps[2].data = d2;
	img->color_space = OPJ_CLRSPC_SRGB;
	return;

fails:
	free(r);
	free(g);
	free(b);
}